

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ipc-send-recv.c
# Opt level: O0

void ipc_send_recv_helper_threadproc(void *arg)

{
  undefined1 local_368 [8];
  uv_loop_t loop;
  int r;
  void *arg_local;
  
  loop._844_4_ = uv_loop_init((uv_loop_t *)local_368);
  if (loop._844_4_ != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ipc-send-recv.c"
            ,0x1a6,"r == 0");
    abort();
  }
  loop._844_4_ = run_ipc_send_recv_helper((uv_loop_t *)local_368,1);
  if (loop._844_4_ != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ipc-send-recv.c"
            ,0x1a9,"r == 0");
    abort();
  }
  loop._844_4_ = uv_loop_close((uv_loop_t *)local_368);
  if (loop._844_4_ != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ipc-send-recv.c"
            ,0x1ac,"r == 0");
    abort();
  }
  return;
}

Assistant:

void ipc_send_recv_helper_threadproc(void* arg) {
  int r;
  uv_loop_t loop;

  r = uv_loop_init(&loop);
  ASSERT(r == 0);

  r = run_ipc_send_recv_helper(&loop, 1);
  ASSERT(r == 0);

  r = uv_loop_close(&loop);
  ASSERT(r == 0);
}